

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompositeATN.hpp
# Opt level: O1

int __thiscall
Centaurus::CATNMachine<wchar_t>::import_literal_terminal
          (CATNMachine<wchar_t> *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *literal,
          int origin,int tag)

{
  wchar_t start;
  size_type sVar1;
  pointer pwVar2;
  long lVar3;
  CharClass<wchar_t> local_50;
  
  sVar1 = literal->_M_string_length;
  if (sVar1 != 0) {
    pwVar2 = (literal->_M_dataplus)._M_p;
    lVar3 = 0;
    do {
      start = *(wchar_t *)((long)pwVar2 + lVar3);
      CharClass<wchar_t>::CharClass(&local_50,start,start + L'\x01');
      origin = add_node(this,&local_50,origin,tag);
      local_50._vptr_CharClass = (_func_int **)&PTR__CharClass_001bf4d0;
      std::vector<Centaurus::Range<wchar_t>,_std::allocator<Centaurus::Range<wchar_t>_>_>::~vector
                (&local_50.m_ranges);
      lVar3 = lVar3 + 4;
      tag = 0;
    } while (sVar1 << 2 != lVar3);
  }
  return origin;
}

Assistant:

int import_literal_terminal(const std::basic_string<TCHAR>& literal, int origin, int tag)
    {
        for (TCHAR ch : literal)
        {
            origin = add_node(CharClass<TCHAR>(ch, ch + 1), origin, tag);
            tag = 0;
        }
        return origin;
    }